

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx_functor::unary_op_acos>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  long *in_RDI;
  float fVar22;
  undefined1 auVar23 [32];
  undefined1 in_ZMM2 [64];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_acos op;
  Mat *m;
  __m256 big_final_approx;
  __m256 small_final_approx;
  __m256 x1;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 big_input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_pi;
  __m256 magic_half_pi;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_one;
  __m256 magic_half_one;
  __m256 magic_zero;
  __m256 magic_negative_zero;
  __m128 big_final_approx_1;
  __m128 small_final_approx_1;
  __m128 x1_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 big_input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_pi_1;
  __m128 magic_half_pi_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_one_1;
  __m128 magic_half_one_1;
  __m128 magic_zero_1;
  __m128 magic_negative_zero_1;
  undefined1 local_18d0 [16];
  undefined1 local_18c0 [32];
  int local_189c;
  undefined8 local_1898;
  undefined8 local_1890;
  undefined8 local_1888;
  undefined4 local_1880;
  long local_1878;
  undefined4 local_1870;
  undefined4 local_186c;
  undefined4 local_1868;
  undefined4 local_1864;
  undefined4 local_1860;
  undefined8 local_1858;
  undefined1 (*local_1850) [32];
  int local_1848;
  int local_1844;
  int local_1840;
  int local_183c;
  int local_1838;
  int local_1834;
  int local_1830;
  undefined1 local_1829 [9];
  long *local_1820;
  undefined1 local_1815;
  int local_1814;
  undefined8 *local_1808;
  undefined8 *local_1800;
  undefined8 *local_17f0;
  undefined1 (*local_17e8) [32];
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined1 (*local_17b0) [32];
  undefined1 (*local_17a8) [32];
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined1 (*local_1790) [32];
  long local_1788;
  undefined4 local_177c;
  long local_1778;
  undefined1 (*local_1770) [32];
  undefined4 local_1764;
  int local_1760;
  int local_175c;
  undefined8 *local_1758;
  undefined4 local_174c;
  long local_1748;
  undefined8 *local_1738;
  undefined1 *local_1710;
  undefined1 *local_1708;
  undefined1 *local_1700;
  undefined1 *local_16f8;
  undefined1 (*local_16f0) [32];
  undefined1 *local_16e8;
  float local_16e0;
  float fStack_16dc;
  float fStack_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  float fStack_16c8;
  float fStack_16c4;
  undefined1 local_16c0 [32];
  float local_16a0;
  float fStack_169c;
  float fStack_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float fStack_1688;
  float fStack_1684;
  float local_1680;
  float fStack_167c;
  float fStack_1678;
  float fStack_1674;
  float fStack_1670;
  float fStack_166c;
  float fStack_1668;
  float fStack_1664;
  float local_1660;
  float fStack_165c;
  float fStack_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float fStack_1648;
  float fStack_1644;
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  float fStack_1624;
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float fStack_1608;
  float fStack_1604;
  float local_1600;
  float fStack_15fc;
  float fStack_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float fStack_15e8;
  float fStack_15e4;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  undefined4 uStack_15c4;
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float fStack_15a8;
  undefined4 uStack_15a4;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [32];
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined1 local_1260 [32];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  undefined4 uStack_10c4;
  float *local_10b8;
  float *local_10b0;
  float *local_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 *local_1058;
  float *local_1050;
  float *local_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 *local_ff8;
  undefined8 *local_ff0;
  float *local_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 *local_f98;
  float *local_f90;
  float *local_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 *local_f38;
  undefined8 *local_f30;
  float *local_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float fStack_ea4;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float fStack_e28;
  float fStack_e24;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  float local_e00;
  float fStack_dfc;
  float fStack_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  float fStack_de8;
  float fStack_de4;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  float local_dc0;
  float fStack_dbc;
  float fStack_db8;
  float fStack_db4;
  float fStack_db0;
  float fStack_dac;
  float fStack_da8;
  float fStack_da4;
  undefined1 local_da0 [8];
  float fStack_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  float fStack_d88;
  float fStack_d84;
  undefined1 local_d80 [8];
  float fStack_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  float fStack_d68;
  float fStack_d64;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 local_c00 [32];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined4 local_b50;
  undefined4 local_b4c;
  undefined4 local_b48;
  undefined4 local_b44;
  undefined4 local_b40;
  undefined4 local_b3c;
  undefined4 local_b38;
  undefined4 local_b34;
  undefined4 local_b30;
  undefined4 local_b2c;
  undefined4 local_b28;
  undefined4 local_b24;
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  undefined4 local_b00;
  undefined4 local_afc;
  undefined4 local_af8;
  undefined4 local_af4;
  undefined4 local_af0;
  undefined4 local_aec;
  undefined4 local_ae8;
  undefined4 local_ae4;
  undefined1 local_ae0 [16];
  undefined1 auStack_ad0 [16];
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  undefined4 local_aac;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined1 local_aa0 [16];
  undefined1 auStack_a90 [16];
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined1 local_a60 [16];
  undefined1 auStack_a50 [16];
  undefined4 local_a40;
  undefined4 local_a3c;
  undefined4 local_a38;
  undefined4 local_a34;
  undefined4 local_a30;
  undefined4 local_a2c;
  undefined4 local_a28;
  undefined4 local_a24;
  undefined1 local_a20 [16];
  undefined1 auStack_a10 [16];
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 local_9ec;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined1 local_9e0 [16];
  undefined1 auStack_9d0 [16];
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined1 local_9a0 [16];
  undefined1 auStack_990 [16];
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 local_968;
  undefined4 local_964;
  undefined1 local_960 [16];
  undefined1 auStack_950 [16];
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined4 local_92c;
  undefined4 local_928;
  undefined4 local_924;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined4 local_900;
  undefined4 local_8fc;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  undefined4 local_864;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  undefined4 local_824;
  undefined4 local_820;
  undefined4 local_81c;
  undefined4 local_818;
  undefined4 local_814;
  float local_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [16];
  float local_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float local_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float local_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined1 local_5d0 [16];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  float local_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  float *local_4b8;
  float *local_4b0;
  float *local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  float local_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined8 *local_458;
  float *local_450;
  float *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  float local_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  float *local_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  float local_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined8 *local_398;
  float *local_390;
  float *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 *local_338;
  undefined8 *local_330;
  float *local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  float local_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined8 local_2a0;
  undefined8 uStack_298;
  float local_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_34;
  
  local_1830 = *(int *)((long)in_RDI + 0x2c);
  local_1834 = (int)in_RDI[6];
  local_1838 = *(int *)((long)in_RDI + 0x34);
  local_183c = (int)in_RDI[7];
  local_1840 = (int)in_RDI[3];
  local_1844 = local_1830 * local_1834 * local_1838 * local_1840;
  local_1820 = in_RDI;
  for (local_1848 = 0; local_1848 < local_183c; local_1848 = local_1848 + 1) {
    local_1808 = &local_1898;
    local_175c = *(int *)((long)local_1820 + 0x2c);
    local_1760 = (int)local_1820[6];
    local_1764 = *(undefined4 *)((long)local_1820 + 0x34);
    local_1770 = (undefined1 (*) [32])
                 (*local_1820 + local_1820[8] * (long)local_1848 * local_1820[2]);
    local_1778 = local_1820[2];
    local_177c = (undefined4)local_1820[3];
    local_1788 = local_1820[4];
    local_1758 = &local_1898;
    local_1748 = (long)local_175c * (long)local_1760 * local_1778;
    local_1800 = &local_1898;
    local_17f0 = &local_1898;
    local_174c = 0x10;
    local_1814 = local_1848;
    local_1815 = 1;
    local_1898 = 0;
    local_1888 = 0;
    local_1880 = 0;
    local_1870 = 0;
    local_186c = 0;
    local_1868 = 0;
    local_1864 = 0;
    local_1860 = 0;
    local_1858 = 0;
    local_1890 = 0;
    local_1850 = local_1770;
    for (local_189c = 0; local_189c + 7 < local_1844; local_189c = local_189c + 8) {
      local_17e8 = local_1850;
      auVar5 = *local_1850;
      local_1708 = local_1829;
      local_1710 = local_18c0;
      local_18c0._0_8_ = auVar5._0_8_;
      local_1380 = local_18c0._0_8_;
      local_18c0._8_8_ = auVar5._8_8_;
      uStack_1378 = local_18c0._8_8_;
      local_18c0._16_8_ = auVar5._16_8_;
      uStack_1370 = local_18c0._16_8_;
      local_18c0._24_8_ = auVar5._24_8_;
      uStack_1368 = local_18c0._24_8_;
      local_b24 = 0x80000000;
      local_b00 = 0x80000000;
      auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
      local_b20 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
      auStack_b10 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
      local_13a0 = local_b20._0_8_;
      uStack_1398 = local_b20._8_8_;
      uStack_1390 = auStack_b10._0_8_;
      uStack_1388 = auStack_b10._8_8_;
      local_b28 = 0;
      local_ac0 = 0;
      auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
      local_ae0 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
      auStack_ad0 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
      local_13c0 = local_ae0._0_8_;
      uStack_13b8 = local_ae0._8_8_;
      uStack_13b0 = auStack_ad0._0_8_;
      uStack_13a8 = auStack_ad0._8_8_;
      local_b2c = 0x3f000000;
      local_a80 = 0x3f000000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x20);
      local_aa0 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x20);
      auStack_a90 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x30);
      local_13e0 = local_aa0._0_8_;
      uStack_13d8 = local_aa0._8_8_;
      uStack_13d0 = auStack_a90._0_8_;
      uStack_13c8 = auStack_a90._8_8_;
      local_b30 = 0x3f800000;
      local_a40 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_a60 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_a50 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_1400 = local_a60._0_8_;
      uStack_13f8 = local_a60._8_8_;
      uStack_13f0 = auStack_a50._0_8_;
      uStack_13e8 = auStack_a50._8_8_;
      local_b34 = 0x3cc48f19;
      local_a00 = 0x3cc48f19;
      auVar2 = vinsertps_avx(ZEXT416(0x3cc48f19),ZEXT416(0x3cc48f19),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3cc48f19),0x20);
      local_a20 = vinsertps_avx(auVar2,ZEXT416(0x3cc48f19),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3cc48f19),ZEXT416(0x3cc48f19),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3cc48f19),0x20);
      auStack_a10 = vinsertps_avx(auVar2,ZEXT416(0x3cc48f19),0x30);
      local_1420 = local_a20._0_8_;
      uStack_1418 = local_a20._8_8_;
      uStack_1410 = auStack_a10._0_8_;
      uStack_1408 = auStack_a10._8_8_;
      local_b38 = 0x3d2dbdcf;
      local_9c0 = 0x3d2dbdcf;
      auVar2 = vinsertps_avx(ZEXT416(0x3d2dbdcf),ZEXT416(0x3d2dbdcf),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2dbdcf),0x20);
      local_9e0 = vinsertps_avx(auVar2,ZEXT416(0x3d2dbdcf),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d2dbdcf),ZEXT416(0x3d2dbdcf),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2dbdcf),0x20);
      auStack_9d0 = vinsertps_avx(auVar2,ZEXT416(0x3d2dbdcf),0x30);
      local_1440 = local_9e0._0_8_;
      uStack_1438 = local_9e0._8_8_;
      uStack_1430 = auStack_9d0._0_8_;
      uStack_1428 = auStack_9d0._8_8_;
      local_b3c = 0x3d997dcc;
      local_980 = 0x3d997dcc;
      auVar2 = vinsertps_avx(ZEXT416(0x3d997dcc),ZEXT416(0x3d997dcc),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d997dcc),0x20);
      local_9a0 = vinsertps_avx(auVar2,ZEXT416(0x3d997dcc),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d997dcc),ZEXT416(0x3d997dcc),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d997dcc),0x20);
      auStack_990 = vinsertps_avx(auVar2,ZEXT416(0x3d997dcc),0x30);
      local_1460 = local_9a0._0_8_;
      uStack_1458 = local_9a0._8_8_;
      uStack_1450 = auStack_990._0_8_;
      uStack_1448 = auStack_990._8_8_;
      local_b40 = 0x3d3a73d8;
      local_940 = 0x3d3a73d8;
      auVar2 = vinsertps_avx(ZEXT416(0x3d3a73d8),ZEXT416(0x3d3a73d8),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d3a73d8),0x20);
      local_960 = vinsertps_avx(auVar2,ZEXT416(0x3d3a73d8),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d3a73d8),ZEXT416(0x3d3a73d8),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d3a73d8),0x20);
      auStack_950 = vinsertps_avx(auVar2,ZEXT416(0x3d3a73d8),0x30);
      local_1480 = local_960._0_8_;
      uStack_1478 = local_960._8_8_;
      uStack_1470 = auStack_950._0_8_;
      uStack_1468 = auStack_950._8_8_;
      local_b44 = 0x3f800000;
      local_900 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_920 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_910 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_14a0 = local_920._0_8_;
      uStack_1498 = local_920._8_8_;
      uStack_1490 = auStack_910._0_8_;
      uStack_1488 = auStack_910._8_8_;
      local_b48 = 0x3e2aaaf8;
      local_8c0 = 0x3e2aaaf8;
      auVar2 = vinsertps_avx(ZEXT416(0x3e2aaaf8),ZEXT416(0x3e2aaaf8),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e2aaaf8),0x20);
      local_8e0 = vinsertps_avx(auVar2,ZEXT416(0x3e2aaaf8),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3e2aaaf8),ZEXT416(0x3e2aaaf8),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e2aaaf8),0x20);
      auStack_8d0 = vinsertps_avx(auVar2,ZEXT416(0x3e2aaaf8),0x30);
      local_14c0 = local_8e0._0_8_;
      uStack_14b8 = local_8e0._8_8_;
      uStack_14b0 = auStack_8d0._0_8_;
      uStack_14a8 = auStack_8d0._8_8_;
      local_b4c = 0x3fc90fdb;
      local_880 = 0x3fc90fdb;
      auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
      local_8a0 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
      auStack_890 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
      local_14e0 = local_8a0._0_8_;
      uStack_14d8 = local_8a0._8_8_;
      uStack_14d0 = auStack_890._0_8_;
      uStack_14c8 = auStack_890._8_8_;
      local_b50 = 0x40490fdb;
      local_830 = 0x40490fdb;
      auVar2 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x20);
      local_860 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x20);
      auStack_850 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x30);
      local_1500 = local_860._0_8_;
      uStack_14f8 = local_860._8_8_;
      uStack_14f0 = auStack_850._0_8_;
      uStack_14e8 = auStack_850._8_8_;
      local_1280 = local_b20._0_8_;
      uStack_1278 = local_b20._8_8_;
      uStack_1270 = auStack_b10._0_8_;
      uStack_1268 = auStack_b10._8_8_;
      auVar1._16_8_ = auStack_b10._0_8_;
      auVar1._0_16_ = local_b20;
      auVar1._24_8_ = auStack_b10._8_8_;
      local_1520 = vandps_avx(auVar1,auVar5);
      local_b80 = local_b20._0_8_;
      uStack_b78 = local_b20._8_8_;
      uStack_b70 = auStack_b10._0_8_;
      uStack_b68 = auStack_b10._8_8_;
      auVar12._16_8_ = auStack_b10._0_8_;
      auVar12._0_16_ = local_b20;
      auVar12._24_8_ = auStack_b10._8_8_;
      auVar1 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      local_1540 = vandnps_avx(auVar12,auVar5);
      auVar3._16_8_ = auStack_a90._0_8_;
      auVar3._0_16_ = local_aa0;
      auVar3._24_8_ = auStack_a90._8_8_;
      local_1560 = vcmpps_avx(local_1540,auVar3,2);
      local_1200 = local_a60._0_8_;
      uStack_11f8 = local_a60._8_8_;
      uStack_11f0 = auStack_a50._0_8_;
      uStack_11e8 = auStack_a50._8_8_;
      local_1220 = local_1540._0_8_;
      uStack_1218 = local_1540._8_8_;
      uStack_1210 = local_1540._16_8_;
      uStack_1208 = local_1540._24_8_;
      auVar7._16_8_ = auStack_a50._0_8_;
      auVar7._0_16_ = local_a60;
      auVar7._24_8_ = auStack_a50._8_8_;
      _local_1120 = vsubps_avx(auVar7,local_1540);
      local_1100._0_4_ = local_aa0._0_4_;
      local_1100._4_4_ = local_aa0._4_4_;
      uStack_10f8._0_4_ = local_aa0._8_4_;
      uStack_10f8._4_4_ = local_aa0._12_4_;
      uStack_10f0._0_4_ = auStack_a90._0_4_;
      uStack_10f0._4_4_ = auStack_a90._4_4_;
      uStack_10e8._0_4_ = auStack_a90._8_4_;
      uStack_10e8._4_4_ = auStack_a90._12_4_;
      uStack_10c4 = uStack_10e8._4_4_;
      local_10e0 = (float)local_1100 * (float)local_1120._0_4_;
      fStack_10dc = local_1100._4_4_ * (float)local_1120._4_4_;
      fStack_10d8 = (float)uStack_10f8 * fStack_1118;
      fStack_10d4 = uStack_10f8._4_4_ * fStack_1114;
      fStack_10d0 = (float)uStack_10f0 * fStack_1110;
      fStack_10cc = uStack_10f0._4_4_ * fStack_110c;
      fStack_10c8 = (float)uStack_10e8 * fStack_1108;
      auVar8._4_4_ = fStack_10dc;
      auVar8._0_4_ = local_10e0;
      auVar8._8_4_ = fStack_10d8;
      auVar8._12_4_ = fStack_10d4;
      auVar8._16_4_ = fStack_10d0;
      auVar8._20_4_ = fStack_10cc;
      auVar8._24_4_ = fStack_10c8;
      auVar8._28_4_ = uStack_10e8._4_4_;
      local_1580 = vsqrtps_avx(auVar8);
      local_12c0 = local_1560._0_8_;
      uStack_12b8 = local_1560._8_8_;
      uStack_12b0 = local_1560._16_8_;
      uStack_12a8 = local_1560._24_8_;
      local_12e0 = local_1540._0_8_;
      uStack_12d8 = local_1540._8_8_;
      uStack_12d0 = local_1540._16_8_;
      uStack_12c8 = local_1540._24_8_;
      local_c40 = vandps_avx(local_1560,local_1540);
      local_bc0 = local_1560._0_8_;
      uStack_bb8 = local_1560._8_8_;
      uStack_bb0 = local_1560._16_8_;
      uStack_ba8 = local_1560._24_8_;
      local_be0 = local_1580._0_8_;
      uStack_bd8 = local_1580._8_8_;
      uStack_bd0 = local_1580._16_8_;
      uStack_bc8 = local_1580._24_8_;
      local_c60 = vandnps_avx(local_1560,local_1580);
      local_15a0 = vorps_avx(local_c40,local_c60);
      local_1160 = local_15a0._0_8_;
      uStack_1158 = local_15a0._8_8_;
      uStack_1150 = local_15a0._16_8_;
      uStack_1148 = local_15a0._24_8_;
      local_1140._0_4_ = local_15a0._0_4_;
      local_1140._4_4_ = local_15a0._4_4_;
      uStack_1138._0_4_ = local_15a0._8_4_;
      uStack_1138._4_4_ = local_15a0._12_4_;
      uStack_1130._0_4_ = local_15a0._16_4_;
      uStack_1130._4_4_ = local_15a0._20_4_;
      uStack_1128._0_4_ = local_15a0._24_4_;
      uStack_1128._4_4_ = local_15a0._28_4_;
      uStack_15a4 = uStack_1128._4_4_;
      local_15c0 = (float)local_1140 * (float)local_1140;
      fStack_15bc = local_1140._4_4_ * local_1140._4_4_;
      fStack_15b8 = (float)uStack_1138 * (float)uStack_1138;
      fStack_15b4 = uStack_1138._4_4_ * uStack_1138._4_4_;
      fStack_15b0 = (float)uStack_1130 * (float)uStack_1130;
      fStack_15ac = uStack_1130._4_4_ * uStack_1130._4_4_;
      fStack_15a8 = (float)uStack_1128 * (float)uStack_1128;
      local_11a0 = CONCAT44(fStack_15bc,local_15c0);
      uStack_1198 = CONCAT44(fStack_15b4,fStack_15b8);
      uStack_1190 = CONCAT44(fStack_15ac,fStack_15b0);
      uStack_1188 = CONCAT44(uStack_1128._4_4_,fStack_15a8);
      uStack_15c4 = uStack_1128._4_4_;
      local_15e0 = local_15c0 * local_15c0;
      fStack_15dc = fStack_15bc * fStack_15bc;
      fStack_15d8 = fStack_15b8 * fStack_15b8;
      fStack_15d4 = fStack_15b4 * fStack_15b4;
      fStack_15d0 = fStack_15b0 * fStack_15b0;
      fStack_15cc = fStack_15ac * fStack_15ac;
      fStack_15c8 = fStack_15a8 * fStack_15a8;
      local_1048 = &local_15e0;
      local_f30 = &local_1440;
      local_f38 = &local_1480;
      local_f00 = CONCAT44(fStack_15dc,local_15e0);
      uStack_ef8 = CONCAT44(fStack_15d4,fStack_15d8);
      uStack_ef0 = CONCAT44(fStack_15cc,fStack_15d0);
      uStack_ee8 = CONCAT44(uStack_1128._4_4_,fStack_15c8);
      local_f20._0_4_ = local_9e0._0_4_;
      local_f20._4_4_ = local_9e0._4_4_;
      uStack_f18._0_4_ = local_9e0._8_4_;
      uStack_f18._4_4_ = local_9e0._12_4_;
      uStack_f10._0_4_ = auStack_9d0._0_4_;
      uStack_f10._4_4_ = auStack_9d0._4_4_;
      uStack_f08._0_4_ = auStack_9d0._8_4_;
      uStack_f08._4_4_ = auStack_9d0._12_4_;
      fStack_ea4 = uStack_f08._4_4_;
      local_ec0 = local_15e0 * (float)local_f20;
      fStack_ebc = fStack_15dc * local_f20._4_4_;
      fStack_eb8 = fStack_15d8 * (float)uStack_f18;
      fStack_eb4 = fStack_15d4 * uStack_f18._4_4_;
      fStack_eb0 = fStack_15d0 * (float)uStack_f10;
      fStack_eac = fStack_15cc * uStack_f10._4_4_;
      fStack_ea8 = fStack_15c8 * (float)uStack_f08;
      local_ee0._0_4_ = local_960._0_4_;
      local_ee0._4_4_ = local_960._4_4_;
      uStack_ed8._0_4_ = local_960._8_4_;
      uStack_ed8._4_4_ = local_960._12_4_;
      uStack_ed0._0_4_ = auStack_950._0_4_;
      uStack_ed0._4_4_ = auStack_950._4_4_;
      uStack_ec8._0_4_ = auStack_950._8_4_;
      uStack_ec8._4_4_ = auStack_950._12_4_;
      local_1640 = local_ec0 + (float)local_ee0;
      fStack_163c = fStack_ebc + local_ee0._4_4_;
      fStack_1638 = fStack_eb8 + (float)uStack_ed8;
      fStack_1634 = fStack_eb4 + uStack_ed8._4_4_;
      fStack_1630 = fStack_eb0 + (float)uStack_ed0;
      fStack_162c = fStack_eac + uStack_ed0._4_4_;
      fStack_1628 = fStack_ea8 + (float)uStack_ec8;
      fStack_1624 = uStack_f08._4_4_ + uStack_ec8._4_4_;
      local_f90 = &local_1640;
      local_f98 = &local_14c0;
      local_f60 = CONCAT44(fStack_15dc,local_15e0);
      uStack_f58 = CONCAT44(fStack_15d4,fStack_15d8);
      uStack_f50 = CONCAT44(fStack_15cc,fStack_15d0);
      uStack_f48 = CONCAT44(uStack_1128._4_4_,fStack_15c8);
      local_f80 = CONCAT44(fStack_163c,local_1640);
      uStack_f78 = CONCAT44(fStack_1634,fStack_1638);
      uStack_f70 = CONCAT44(fStack_162c,fStack_1630);
      uStack_f68 = CONCAT44(fStack_1624,fStack_1628);
      local_e80 = local_15e0 * local_1640;
      fStack_e7c = fStack_15dc * fStack_163c;
      fStack_e78 = fStack_15d8 * fStack_1638;
      fStack_e74 = fStack_15d4 * fStack_1634;
      fStack_e70 = fStack_15d0 * fStack_1630;
      fStack_e6c = fStack_15cc * fStack_162c;
      fStack_e68 = fStack_15c8 * fStack_1628;
      local_ea0._0_4_ = local_8e0._0_4_;
      local_ea0._4_4_ = local_8e0._4_4_;
      uStack_e98._0_4_ = local_8e0._8_4_;
      uStack_e98._4_4_ = local_8e0._12_4_;
      uStack_e90._0_4_ = auStack_8d0._0_4_;
      uStack_e90._4_4_ = auStack_8d0._4_4_;
      uStack_e88._0_4_ = auStack_8d0._8_4_;
      uStack_e88._4_4_ = auStack_8d0._12_4_;
      local_1620 = local_e80 + (float)local_ea0;
      fStack_161c = fStack_e7c + local_ea0._4_4_;
      fStack_1618 = fStack_e78 + (float)uStack_e98;
      fStack_1614 = fStack_e74 + uStack_e98._4_4_;
      fStack_1610 = fStack_e70 + (float)uStack_e90;
      fStack_160c = fStack_e6c + uStack_e90._4_4_;
      fStack_1608 = fStack_e68 + (float)uStack_e88;
      fStack_1604 = fStack_1624 + uStack_e88._4_4_;
      local_ff0 = &local_1420;
      local_ff8 = &local_1460;
      local_fc0 = CONCAT44(fStack_15dc,local_15e0);
      uStack_fb8 = CONCAT44(fStack_15d4,fStack_15d8);
      uStack_fb0 = CONCAT44(fStack_15cc,fStack_15d0);
      uStack_fa8 = CONCAT44(uStack_1128._4_4_,fStack_15c8);
      local_fe0._0_4_ = local_a20._0_4_;
      local_fe0._4_4_ = local_a20._4_4_;
      uStack_fd8._0_4_ = local_a20._8_4_;
      uStack_fd8._4_4_ = local_a20._12_4_;
      uStack_fd0._0_4_ = auStack_a10._0_4_;
      uStack_fd0._4_4_ = auStack_a10._4_4_;
      uStack_fc8._0_4_ = auStack_a10._8_4_;
      uStack_fc8._4_4_ = auStack_a10._12_4_;
      fStack_e24 = uStack_fc8._4_4_;
      local_e40 = local_15e0 * (float)local_fe0;
      fStack_e3c = fStack_15dc * local_fe0._4_4_;
      fStack_e38 = fStack_15d8 * (float)uStack_fd8;
      fStack_e34 = fStack_15d4 * uStack_fd8._4_4_;
      fStack_e30 = fStack_15d0 * (float)uStack_fd0;
      fStack_e2c = fStack_15cc * uStack_fd0._4_4_;
      fStack_e28 = fStack_15c8 * (float)uStack_fc8;
      local_e60._0_4_ = local_9a0._0_4_;
      local_e60._4_4_ = local_9a0._4_4_;
      uStack_e58._0_4_ = local_9a0._8_4_;
      uStack_e58._4_4_ = local_9a0._12_4_;
      uStack_e50._0_4_ = auStack_990._0_4_;
      uStack_e50._4_4_ = auStack_990._4_4_;
      uStack_e48._0_4_ = auStack_990._8_4_;
      uStack_e48._4_4_ = auStack_990._12_4_;
      local_1680 = local_e40 + (float)local_e60;
      fStack_167c = fStack_e3c + local_e60._4_4_;
      fStack_1678 = fStack_e38 + (float)uStack_e58;
      fStack_1674 = fStack_e34 + uStack_e58._4_4_;
      fStack_1670 = fStack_e30 + (float)uStack_e50;
      fStack_166c = fStack_e2c + uStack_e50._4_4_;
      fStack_1668 = fStack_e28 + (float)uStack_e48;
      fStack_1664 = uStack_fc8._4_4_ + uStack_e48._4_4_;
      local_1050 = &local_1680;
      local_1058 = &local_14a0;
      local_1020 = CONCAT44(fStack_15dc,local_15e0);
      uStack_1018 = CONCAT44(fStack_15d4,fStack_15d8);
      uStack_1010 = CONCAT44(fStack_15cc,fStack_15d0);
      uStack_1008 = CONCAT44(uStack_1128._4_4_,fStack_15c8);
      local_1040 = CONCAT44(fStack_167c,local_1680);
      uStack_1038 = CONCAT44(fStack_1674,fStack_1678);
      uStack_1030 = CONCAT44(fStack_166c,fStack_1670);
      uStack_1028 = CONCAT44(fStack_1664,fStack_1668);
      local_e00 = local_15e0 * local_1680;
      fStack_dfc = fStack_15dc * fStack_167c;
      fStack_df8 = fStack_15d8 * fStack_1678;
      fStack_df4 = fStack_15d4 * fStack_1674;
      fStack_df0 = fStack_15d0 * fStack_1670;
      fStack_dec = fStack_15cc * fStack_166c;
      fStack_de8 = fStack_15c8 * fStack_1668;
      local_e20._0_4_ = local_920._0_4_;
      local_e20._4_4_ = local_920._4_4_;
      uStack_e18._0_4_ = local_920._8_4_;
      uStack_e18._4_4_ = local_920._12_4_;
      uStack_e10._0_4_ = auStack_910._0_4_;
      uStack_e10._4_4_ = auStack_910._4_4_;
      uStack_e08._0_4_ = auStack_910._8_4_;
      uStack_e08._4_4_ = auStack_910._12_4_;
      local_1660 = local_e00 + (float)local_e20;
      fStack_165c = fStack_dfc + local_e20._4_4_;
      fStack_1658 = fStack_df8 + (float)uStack_e18;
      fStack_1654 = fStack_df4 + uStack_e18._4_4_;
      fStack_1650 = fStack_df0 + (float)uStack_e10;
      fStack_164c = fStack_dec + uStack_e10._4_4_;
      fStack_1648 = fStack_de8 + (float)uStack_e08;
      fStack_1644 = fStack_1664 + uStack_e08._4_4_;
      local_10a8 = &local_15c0;
      local_10b0 = &local_1620;
      local_10b8 = &local_1660;
      local_1080 = CONCAT44(fStack_15bc,local_15c0);
      uStack_1078 = CONCAT44(fStack_15b4,fStack_15b8);
      uStack_1070 = CONCAT44(fStack_15ac,fStack_15b0);
      uStack_1068 = CONCAT44(uStack_1128._4_4_,fStack_15a8);
      local_10a0 = CONCAT44(fStack_161c,local_1620);
      uStack_1098 = CONCAT44(fStack_1614,fStack_1618);
      uStack_1090 = CONCAT44(fStack_160c,fStack_1610);
      uStack_1088 = CONCAT44(fStack_1604,fStack_1608);
      local_dc0 = local_15c0 * local_1620;
      fStack_dbc = fStack_15bc * fStack_161c;
      fStack_db8 = fStack_15b8 * fStack_1618;
      fStack_db4 = fStack_15b4 * fStack_1614;
      fStack_db0 = fStack_15b0 * fStack_1610;
      fStack_dac = fStack_15ac * fStack_160c;
      fStack_da8 = fStack_15a8 * fStack_1608;
      local_de0 = CONCAT44(fStack_165c,local_1660);
      uStack_dd8 = CONCAT44(fStack_1654,fStack_1658);
      uStack_dd0 = CONCAT44(fStack_164c,fStack_1650);
      uStack_dc8 = CONCAT44(fStack_1644,fStack_1648);
      local_1600 = local_dc0 + local_1660;
      fStack_15fc = fStack_dbc + fStack_165c;
      fStack_15f8 = fStack_db8 + fStack_1658;
      fStack_15f4 = fStack_db4 + fStack_1654;
      fStack_15f0 = fStack_db0 + fStack_1650;
      fStack_15ec = fStack_dac + fStack_164c;
      fStack_15e8 = fStack_da8 + fStack_1648;
      fStack_1684 = fStack_1604 + fStack_1644;
      local_11c0 = CONCAT44(fStack_15fc,local_1600);
      uStack_11b8 = CONCAT44(fStack_15f4,fStack_15f8);
      uStack_11b0 = CONCAT44(fStack_15ec,fStack_15f0);
      uStack_11a8 = CONCAT44(fStack_1684,fStack_15e8);
      local_11e0 = local_15a0._0_8_;
      uStack_11d8 = local_15a0._8_8_;
      uStack_11d0 = local_15a0._16_8_;
      uStack_11c8 = local_15a0._24_8_;
      local_16a0 = local_1600 * (float)local_1140;
      fStack_169c = fStack_15fc * local_1140._4_4_;
      fStack_1698 = fStack_15f8 * (float)uStack_1138;
      fStack_1694 = fStack_15f4 * uStack_1138._4_4_;
      fStack_1690 = fStack_15f0 * (float)uStack_1130;
      fStack_168c = fStack_15ec * uStack_1130._4_4_;
      fStack_1688 = fStack_15e8 * (float)uStack_1128;
      local_1240 = local_8a0._0_8_;
      uStack_1238 = local_8a0._8_8_;
      uStack_1230 = auStack_890._0_8_;
      uStack_1228 = auStack_890._8_8_;
      local_c80 = CONCAT44(fStack_169c,local_16a0);
      uStack_c78 = CONCAT44(fStack_1694,fStack_1698);
      uStack_c70 = CONCAT44(fStack_168c,fStack_1690);
      uStack_c68 = CONCAT44(fStack_1684,fStack_1688);
      local_ca0 = local_1520._0_8_;
      uStack_c98 = local_1520._8_8_;
      uStack_c90 = local_1520._16_8_;
      uStack_c88 = local_1520._24_8_;
      auVar10._8_8_ = uStack_c78;
      auVar10._0_8_ = local_c80;
      auVar10._16_8_ = uStack_c70;
      auVar10._24_8_ = uStack_c68;
      local_1260 = vorps_avx(auVar10,local_1520);
      auVar6._16_8_ = auStack_890._0_8_;
      auVar6._0_16_ = local_8a0;
      auVar6._24_8_ = auStack_890._8_8_;
      local_16c0 = vsubps_avx(auVar6,local_1260);
      auVar4._16_8_ = auStack_ad0._0_8_;
      auVar4._0_16_ = local_ae0;
      auVar4._24_8_ = auStack_ad0._8_8_;
      local_1300 = vcmpps_avx(auVar5,auVar4,1);
      local_1320 = local_860._0_8_;
      uStack_1318 = local_860._8_8_;
      uStack_1310 = auStack_850._0_8_;
      uStack_1308 = auStack_850._8_8_;
      auVar5._16_8_ = auStack_850._0_8_;
      auVar5._0_16_ = local_860;
      auVar5._24_8_ = auStack_850._8_8_;
      _local_d80 = vandps_avx(local_1300,auVar5);
      local_d60 = CONCAT44(fStack_169c,local_16a0);
      uStack_d58 = CONCAT44(fStack_1694,fStack_1698);
      uStack_d50 = CONCAT44(fStack_168c,fStack_1690);
      uStack_d48 = CONCAT44(fStack_1684,fStack_1688);
      local_cc0 = local_16a0 + local_16a0;
      fStack_cbc = fStack_169c + fStack_169c;
      fStack_cb8 = fStack_1698 + fStack_1698;
      fStack_cb4 = fStack_1694 + fStack_1694;
      fStack_cb0 = fStack_1690 + fStack_1690;
      fStack_cac = fStack_168c + fStack_168c;
      fStack_ca8 = fStack_1688 + fStack_1688;
      fStack_ca4 = fStack_1684 + fStack_1684;
      local_ce0 = local_1520._0_8_;
      uStack_cd8 = local_1520._8_8_;
      uStack_cd0 = local_1520._16_8_;
      uStack_cc8 = local_1520._24_8_;
      auVar9._4_4_ = fStack_cbc;
      auVar9._0_4_ = local_cc0;
      auVar9._8_4_ = fStack_cb8;
      auVar9._12_4_ = fStack_cb4;
      auVar9._16_4_ = fStack_cb0;
      auVar9._20_4_ = fStack_cac;
      auVar9._24_4_ = fStack_ca8;
      auVar9._28_4_ = fStack_ca4;
      _local_da0 = vorps_avx(auVar9,local_1520);
      local_16e0 = (float)local_d80._0_4_ + (float)local_da0._0_4_;
      fStack_16dc = (float)local_d80._4_4_ + (float)local_da0._4_4_;
      fStack_16d8 = fStack_d78 + fStack_d98;
      fStack_16d4 = fStack_d74 + fStack_d94;
      fStack_16d0 = fStack_d70 + fStack_d90;
      fStack_16cc = fStack_d6c + fStack_d8c;
      fStack_16c8 = fStack_d68 + fStack_d88;
      fStack_16c4 = fStack_d64 + fStack_d84;
      local_1340 = local_1560._0_8_;
      uStack_1338 = local_1560._8_8_;
      uStack_1330 = local_1560._16_8_;
      uStack_1328 = local_1560._24_8_;
      local_1360 = local_16c0._0_8_;
      uStack_1358 = local_16c0._8_8_;
      uStack_1350 = local_16c0._16_8_;
      uStack_1348 = local_16c0._24_8_;
      local_d00 = vandps_avx(local_1560,local_16c0);
      local_c20 = CONCAT44(fStack_16dc,local_16e0);
      uStack_c18 = CONCAT44(fStack_16d4,fStack_16d8);
      uStack_c10 = CONCAT44(fStack_16cc,fStack_16d0);
      uStack_c08 = CONCAT44(fStack_16c4,fStack_16c8);
      local_c00._0_4_ = local_1560._0_4_;
      local_c00._4_4_ = local_1560._4_4_;
      local_c00._8_4_ = local_1560._8_4_;
      local_c00._12_4_ = local_1560._12_4_;
      local_c00._16_4_ = local_1560._16_4_;
      local_c00._20_4_ = local_1560._20_4_;
      local_c00._24_4_ = local_1560._24_4_;
      local_c00._28_4_ = local_1560._28_4_;
      auVar23._0_4_ = local_c00._0_4_ ^ auVar1._0_4_;
      auVar23._4_4_ = local_c00._4_4_ ^ auVar1._4_4_;
      auVar23._8_4_ = local_c00._8_4_ ^ auVar1._8_4_;
      auVar23._12_4_ = local_c00._12_4_ ^ auVar1._12_4_;
      auVar23._16_4_ = local_c00._16_4_ ^ auVar1._16_4_;
      auVar23._20_4_ = local_c00._20_4_ ^ auVar1._20_4_;
      auVar23._24_4_ = local_c00._24_4_ ^ auVar1._24_4_;
      auVar23._28_4_ = local_c00._28_4_ ^ auVar1._28_4_;
      auVar11._8_8_ = uStack_c18;
      auVar11._0_8_ = local_c20;
      auVar11._16_8_ = uStack_c10;
      auVar11._24_8_ = uStack_c08;
      in_ZMM2 = ZEXT3264(auVar11);
      local_d20 = vandps_avx(auVar23,auVar11);
      local_18c0 = vorps_avx(local_d00,local_d20);
      local_17b0 = local_1850;
      local_17e0 = local_18c0._0_8_;
      uStack_17d8 = local_18c0._8_8_;
      uStack_17d0 = local_18c0._16_8_;
      uStack_17c8 = local_18c0._24_8_;
      *local_1850 = local_18c0;
      local_1850 = local_1850 + 1;
      fStack_15e4 = fStack_1684;
      local_12a0 = local_1380;
      uStack_1298 = uStack_1378;
      uStack_1290 = uStack_1370;
      uStack_1288 = uStack_1368;
      local_1180 = local_11a0;
      uStack_1178 = uStack_1198;
      uStack_1170 = uStack_1190;
      uStack_1168 = uStack_1188;
      local_1140 = local_1160;
      uStack_1138 = uStack_1158;
      uStack_1130 = uStack_1150;
      uStack_1128 = uStack_1148;
      local_1100 = local_aa0._0_8_;
      uStack_10f8 = local_aa0._8_8_;
      uStack_10f0 = auStack_a90._0_8_;
      uStack_10e8 = auStack_a90._8_8_;
      local_fe8 = local_1048;
      local_fe0 = local_a20._0_8_;
      uStack_fd8 = local_a20._8_8_;
      uStack_fd0 = auStack_a10._0_8_;
      uStack_fc8 = auStack_a10._8_8_;
      local_f88 = local_1048;
      local_f28 = local_1048;
      local_f20 = local_9e0._0_8_;
      uStack_f18 = local_9e0._8_8_;
      uStack_f10 = auStack_9d0._0_8_;
      uStack_f08 = auStack_9d0._8_8_;
      local_ee0 = local_960._0_8_;
      uStack_ed8 = local_960._8_8_;
      uStack_ed0 = auStack_950._0_8_;
      uStack_ec8 = auStack_950._8_8_;
      local_ea0 = local_8e0._0_8_;
      uStack_e98 = local_8e0._8_8_;
      uStack_e90 = auStack_8d0._0_8_;
      uStack_e88 = auStack_8d0._8_8_;
      fStack_e64 = fStack_1624;
      local_e60 = local_9a0._0_8_;
      uStack_e58 = local_9a0._8_8_;
      uStack_e50 = auStack_990._0_8_;
      uStack_e48 = auStack_990._8_8_;
      local_e20 = local_920._0_8_;
      uStack_e18 = local_920._8_8_;
      uStack_e10 = auStack_910._0_8_;
      uStack_e08 = auStack_910._8_8_;
      fStack_de4 = fStack_1664;
      fStack_da4 = fStack_1604;
      local_d40 = local_d60;
      uStack_d38 = uStack_d58;
      uStack_d30 = uStack_d50;
      uStack_d28 = uStack_d48;
      local_c00 = local_1560;
      local_ba0 = local_1380;
      uStack_b98 = uStack_1378;
      uStack_b90 = uStack_1370;
      uStack_b88 = uStack_1368;
      local_afc = local_b00;
      local_af8 = local_b00;
      local_af4 = local_b00;
      local_af0 = local_b00;
      local_aec = local_b00;
      local_ae8 = local_b00;
      local_ae4 = local_b00;
      local_abc = local_ac0;
      local_ab8 = local_ac0;
      local_ab4 = local_ac0;
      local_ab0 = local_ac0;
      local_aac = local_ac0;
      local_aa8 = local_ac0;
      local_aa4 = local_ac0;
      local_a7c = local_a80;
      local_a78 = local_a80;
      local_a74 = local_a80;
      local_a70 = local_a80;
      local_a6c = local_a80;
      local_a68 = local_a80;
      local_a64 = local_a80;
      local_a3c = local_a40;
      local_a38 = local_a40;
      local_a34 = local_a40;
      local_a30 = local_a40;
      local_a2c = local_a40;
      local_a28 = local_a40;
      local_a24 = local_a40;
      local_9fc = local_a00;
      local_9f8 = local_a00;
      local_9f4 = local_a00;
      local_9f0 = local_a00;
      local_9ec = local_a00;
      local_9e8 = local_a00;
      local_9e4 = local_a00;
      local_9bc = local_9c0;
      local_9b8 = local_9c0;
      local_9b4 = local_9c0;
      local_9b0 = local_9c0;
      local_9ac = local_9c0;
      local_9a8 = local_9c0;
      local_9a4 = local_9c0;
      local_97c = local_980;
      local_978 = local_980;
      local_974 = local_980;
      local_970 = local_980;
      local_96c = local_980;
      local_968 = local_980;
      local_964 = local_980;
      local_93c = local_940;
      local_938 = local_940;
      local_934 = local_940;
      local_930 = local_940;
      local_92c = local_940;
      local_928 = local_940;
      local_924 = local_940;
      local_8fc = local_900;
      local_8f8 = local_900;
      local_8f4 = local_900;
      local_8f0 = local_900;
      local_8ec = local_900;
      local_8e8 = local_900;
      local_8e4 = local_900;
      local_8bc = local_8c0;
      local_8b8 = local_8c0;
      local_8b4 = local_8c0;
      local_8b0 = local_8c0;
      local_8ac = local_8c0;
      local_8a8 = local_8c0;
      local_8a4 = local_8c0;
      local_87c = local_880;
      local_878 = local_880;
      local_874 = local_880;
      local_870 = local_880;
      local_86c = local_880;
      local_868 = local_880;
      local_864 = local_880;
      local_82c = local_830;
      local_828 = local_830;
      local_824 = local_830;
      local_820 = local_830;
      local_81c = local_830;
      local_818 = local_830;
      local_814 = local_830;
    }
    for (; local_1738 = local_17f0, local_1878 = local_1788, local_189c + 3 < local_1844;
        local_189c = local_189c + 4) {
      local_17a8 = local_1850;
      auVar13 = *(undefined1 (*) [16])*local_1850;
      local_16f8 = local_1829;
      local_1700 = local_18d0;
      local_18d0._0_8_ = auVar13._0_8_;
      local_660 = local_18d0._0_8_;
      local_18d0._8_8_ = auVar13._8_8_;
      uStack_658 = local_18d0._8_8_;
      local_54 = 0x80000000;
      local_34 = 0x80000000;
      local_50 = 0x80000000;
      local_670 = 0x8000000080000000;
      uStack_668 = 0x8000000080000000;
      local_74 = 0;
      local_58 = 0;
      local_70 = 0;
      local_680 = 0;
      uStack_678 = 0;
      local_94 = 0x3f000000;
      local_78 = 0x3f000000;
      local_90 = 0x3f000000;
      local_690 = 0x3f0000003f000000;
      uStack_688 = 0x3f0000003f000000;
      local_b4 = 0x3f800000;
      local_98 = 0x3f800000;
      local_b0 = 0x3f800000;
      local_6a0 = 0x3f8000003f800000;
      uStack_698 = 0x3f8000003f800000;
      local_d4 = 0x3cc48f19;
      local_b8 = 0x3cc48f19;
      local_d0 = 0x3cc48f19;
      local_6b0 = 0x3cc48f193cc48f19;
      uStack_6a8 = 0x3cc48f193cc48f19;
      local_f4 = 0x3d2dbdcf;
      local_d8 = 0x3d2dbdcf;
      local_f0 = 0x3d2dbdcf;
      local_6c0 = 0x3d2dbdcf3d2dbdcf;
      uStack_6b8 = 0x3d2dbdcf3d2dbdcf;
      local_114 = 0x3d997dcc;
      local_f8 = 0x3d997dcc;
      local_110 = 0x3d997dcc;
      local_6d0 = 0x3d997dcc3d997dcc;
      uStack_6c8 = 0x3d997dcc3d997dcc;
      local_134 = 0x3d3a73d8;
      local_118 = 0x3d3a73d8;
      local_130 = 0x3d3a73d8;
      local_6e0 = 0x3d3a73d83d3a73d8;
      uStack_6d8 = 0x3d3a73d83d3a73d8;
      local_154 = 0x3f800000;
      local_138 = 0x3f800000;
      local_150 = 0x3f800000;
      local_6f0 = 0x3f8000003f800000;
      uStack_6e8 = 0x3f8000003f800000;
      local_174 = 0x3e2aaaf8;
      local_158 = 0x3e2aaaf8;
      local_170 = 0x3e2aaaf8;
      local_700 = 0x3e2aaaf83e2aaaf8;
      uStack_6f8 = 0x3e2aaaf83e2aaaf8;
      local_194 = 0x3fc90fdb;
      local_178 = 0x3fc90fdb;
      local_190 = 0x3fc90fdb;
      local_710 = 0x3fc90fdb3fc90fdb;
      uStack_708 = 0x3fc90fdb3fc90fdb;
      local_1b4 = 0x40490fdb;
      local_198 = 0x40490fdb;
      local_1b0 = 0x40490fdb;
      local_720 = 0x40490fdb40490fdb;
      uStack_718 = 0x40490fdb40490fdb;
      auVar2._8_8_ = 0x8000000080000000;
      auVar2._0_8_ = 0x8000000080000000;
      local_730 = vpand_avx(auVar2,auVar13);
      auVar21._8_8_ = 0x8000000080000000;
      auVar21._0_8_ = 0x8000000080000000;
      auVar2 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
      local_740 = vpandn_avx(auVar21,auVar13);
      local_2d0 = local_740._0_8_;
      uStack_2c8 = local_740._8_8_;
      auVar17._8_8_ = 0x3f0000003f000000;
      auVar17._0_8_ = 0x3f0000003f000000;
      local_750 = vcmpps_avx(local_740,auVar17,2);
      local_5b0 = local_740._0_8_;
      uStack_5a8 = local_740._8_8_;
      auVar15._8_8_ = 0x3f8000003f800000;
      auVar15._0_8_ = 0x3f8000003f800000;
      _local_530 = vsubps_avx(auVar15,local_740);
      local_510 = (float)local_530._0_4_ * 0.5;
      fStack_50c = (float)local_530._4_4_ * 0.5;
      fStack_508 = fStack_528 * 0.5;
      fStack_504 = fStack_524 * 0.5;
      auVar16._4_4_ = fStack_50c;
      auVar16._0_4_ = local_510;
      auVar16._8_4_ = fStack_508;
      auVar16._12_4_ = fStack_504;
      local_760 = vsqrtps_avx(auVar16);
      local_600 = local_750._0_8_;
      uStack_5f8 = local_750._8_8_;
      local_610 = local_740._0_8_;
      uStack_608 = local_740._8_8_;
      local_250 = vpand_avx(local_750,local_740);
      local_1f0 = local_750._0_8_;
      uStack_1e8 = local_750._8_8_;
      local_200 = local_760._0_8_;
      uStack_1f8 = local_760._8_8_;
      local_260 = vpandn_avx(local_750,local_760);
      local_770 = vpor_avx(local_250,local_260);
      local_550 = local_770._0_8_;
      uStack_548 = local_770._8_8_;
      local_540._0_4_ = local_770._0_4_;
      local_540._4_4_ = local_770._4_4_;
      uStack_538._0_4_ = local_770._8_4_;
      uStack_538._4_4_ = local_770._12_4_;
      local_780 = (float)local_540 * (float)local_540;
      fStack_77c = local_540._4_4_ * local_540._4_4_;
      fStack_778 = (float)uStack_538 * (float)uStack_538;
      fStack_774 = uStack_538._4_4_ * uStack_538._4_4_;
      local_570 = CONCAT44(fStack_77c,local_780);
      uStack_568 = CONCAT44(fStack_774,fStack_778);
      local_790 = local_780 * local_780;
      fStack_78c = fStack_77c * fStack_77c;
      fStack_788 = fStack_778 * fStack_778;
      fStack_784 = fStack_774 * fStack_774;
      local_448 = &local_790;
      local_330 = &local_6c0;
      local_338 = &local_6e0;
      local_310 = CONCAT44(fStack_78c,local_790);
      uStack_308 = CONCAT44(fStack_784,fStack_788);
      local_320 = 0x3d2dbdcf3d2dbdcf;
      uStack_318 = 0x3d2dbdcf3d2dbdcf;
      local_2f0 = local_790 * 0.042417344;
      fStack_2ec = fStack_78c * 0.042417344;
      fStack_2e8 = fStack_788 * 0.042417344;
      fStack_2e4 = fStack_784 * 0.042417344;
      local_300 = 0x3d3a73d83d3a73d8;
      uStack_2f8 = 0x3d3a73d83d3a73d8;
      local_7c0 = local_2f0 + 0.045520633;
      fStack_7bc = fStack_2ec + 0.045520633;
      fStack_7b8 = fStack_2e8 + 0.045520633;
      fStack_7b4 = fStack_2e4 + 0.045520633;
      local_390 = &local_7c0;
      local_398 = &local_700;
      local_370 = CONCAT44(fStack_78c,local_790);
      uStack_368 = CONCAT44(fStack_784,fStack_788);
      local_380 = CONCAT44(fStack_7bc,local_7c0);
      uStack_378 = CONCAT44(fStack_7b4,fStack_7b8);
      local_350 = local_790 * local_7c0;
      fStack_34c = fStack_78c * fStack_7bc;
      fStack_348 = fStack_788 * fStack_7b8;
      fStack_344 = fStack_784 * fStack_7b4;
      local_360 = 0x3e2aaaf83e2aaaf8;
      uStack_358 = 0x3e2aaaf83e2aaaf8;
      local_7b0 = local_350 + 0.16666782;
      fStack_7ac = fStack_34c + 0.16666782;
      fStack_7a8 = fStack_348 + 0.16666782;
      fStack_7a4 = fStack_344 + 0.16666782;
      local_3f0 = &local_6b0;
      local_3f8 = &local_6d0;
      local_3d0 = CONCAT44(fStack_78c,local_790);
      uStack_3c8 = CONCAT44(fStack_784,fStack_788);
      local_3e0 = 0x3cc48f193cc48f19;
      uStack_3d8 = 0x3cc48f193cc48f19;
      local_3b0 = local_790 * 0.023994016;
      fStack_3ac = fStack_78c * 0.023994016;
      fStack_3a8 = fStack_788 * 0.023994016;
      fStack_3a4 = fStack_784 * 0.023994016;
      local_3c0 = 0x3d997dcc3d997dcc;
      uStack_3b8 = 0x3d997dcc3d997dcc;
      local_7e0 = local_3b0 + 0.07494697;
      fStack_7dc = fStack_3ac + 0.07494697;
      fStack_7d8 = fStack_3a8 + 0.07494697;
      fStack_7d4 = fStack_3a4 + 0.07494697;
      local_450 = &local_7e0;
      local_458 = &local_6f0;
      local_430 = CONCAT44(fStack_78c,local_790);
      uStack_428 = CONCAT44(fStack_784,fStack_788);
      local_440 = CONCAT44(fStack_7dc,local_7e0);
      uStack_438 = CONCAT44(fStack_7d4,fStack_7d8);
      local_410 = local_790 * local_7e0;
      fStack_40c = fStack_78c * fStack_7dc;
      fStack_408 = fStack_788 * fStack_7d8;
      fStack_404 = fStack_784 * fStack_7d4;
      local_420 = 0x3f8000003f800000;
      uStack_418 = 0x3f8000003f800000;
      local_7d0 = local_410 + 1.0;
      fStack_7cc = fStack_40c + 1.0;
      fStack_7c8 = fStack_408 + 1.0;
      fStack_7c4 = fStack_404 + 1.0;
      local_4a8 = &local_780;
      local_4b0 = &local_7b0;
      local_4b8 = &local_7d0;
      local_490 = CONCAT44(fStack_77c,local_780);
      uStack_488 = CONCAT44(fStack_774,fStack_778);
      local_4a0 = CONCAT44(fStack_7ac,local_7b0);
      uStack_498 = CONCAT44(fStack_7a4,fStack_7a8);
      local_470 = local_780 * local_7b0;
      fStack_46c = fStack_77c * fStack_7ac;
      fStack_468 = fStack_778 * fStack_7a8;
      fStack_464 = fStack_774 * fStack_7a4;
      local_480 = CONCAT44(fStack_7cc,local_7d0);
      uStack_478 = CONCAT44(fStack_7c4,fStack_7c8);
      local_7a0 = local_470 + local_7d0;
      fStack_79c = fStack_46c + fStack_7cc;
      fStack_798 = fStack_468 + fStack_7c8;
      fStack_794 = fStack_464 + fStack_7c4;
      local_580 = CONCAT44(fStack_79c,local_7a0);
      uStack_578 = CONCAT44(fStack_794,fStack_798);
      local_590 = local_770._0_8_;
      uStack_588 = local_770._8_8_;
      local_7f0 = local_7a0 * (float)local_540;
      fStack_7ec = fStack_79c * local_540._4_4_;
      fStack_7e8 = fStack_798 * (float)uStack_538;
      fStack_7e4 = fStack_794 * uStack_538._4_4_;
      local_270 = CONCAT44(fStack_7ec,local_7f0);
      uStack_268 = CONCAT44(fStack_7e4,fStack_7e8);
      local_280 = local_730._0_8_;
      uStack_278 = local_730._8_8_;
      auVar19._8_8_ = uStack_268;
      auVar19._0_8_ = local_270;
      local_5d0 = vpor_avx(auVar19,local_730);
      auVar14._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar14._0_8_ = 0x3fc90fdb3fc90fdb;
      local_800 = vsubps_avx(auVar14,local_5d0);
      local_620 = vcmpps_avx(auVar13,ZEXT816(0),1);
      auVar13._8_8_ = 0x40490fdb40490fdb;
      auVar13._0_8_ = 0x40490fdb40490fdb;
      _local_4f0 = vpand_avx(local_620,auVar13);
      local_4e0 = CONCAT44(fStack_7ec,local_7f0);
      uStack_4d8 = CONCAT44(fStack_7e4,fStack_7e8);
      local_290 = local_7f0 + local_7f0;
      fStack_28c = fStack_7ec + fStack_7ec;
      fStack_288 = fStack_7e8 + fStack_7e8;
      fStack_284 = fStack_7e4 + fStack_7e4;
      local_2a0 = local_730._0_8_;
      uStack_298 = local_730._8_8_;
      auVar18._4_4_ = fStack_28c;
      auVar18._0_4_ = local_290;
      auVar18._8_4_ = fStack_288;
      auVar18._12_4_ = fStack_284;
      _local_500 = vpor_avx(auVar18,local_730);
      local_810 = (float)local_4f0._0_4_ + (float)local_500._0_4_;
      fStack_80c = (float)local_4f0._4_4_ + (float)local_500._4_4_;
      fStack_808 = fStack_4e8 + fStack_4f8;
      fStack_804 = fStack_4e4 + fStack_4f4;
      local_640 = local_750._0_8_;
      uStack_638 = local_750._8_8_;
      local_650 = local_800._0_8_;
      uStack_648 = local_800._8_8_;
      local_2b0 = vpand_avx(local_750,local_800);
      local_220 = CONCAT44(fStack_80c,local_810);
      uStack_218 = CONCAT44(fStack_804,fStack_808);
      auVar20._8_8_ = uStack_218;
      auVar20._0_8_ = local_220;
      in_ZMM2 = ZEXT1664(auVar20);
      local_2c0 = vpand_avx(local_750 ^ auVar2,auVar20);
      local_18d0 = vpor_avx(local_2b0,local_2c0);
      local_1790 = local_1850;
      local_17a0 = local_18d0._0_8_;
      uStack_1798 = local_18d0._8_8_;
      *(undefined1 (*) [16])*local_1850 = local_18d0;
      local_1850 = (undefined1 (*) [32])(*local_1850 + 0x10);
      local_630 = local_720;
      uStack_628 = uStack_718;
      local_5f0 = local_660;
      uStack_5e8 = uStack_658;
      local_5e0 = local_670;
      uStack_5d8 = uStack_668;
      local_5c0 = local_710;
      uStack_5b8 = uStack_708;
      local_5a0 = local_6a0;
      uStack_598 = uStack_698;
      local_560 = local_570;
      uStack_558 = uStack_568;
      local_540 = local_550;
      uStack_538 = uStack_548;
      local_520 = local_690;
      uStack_518 = uStack_688;
      local_4d0 = local_4e0;
      uStack_4c8 = uStack_4d8;
      local_3e8 = local_448;
      local_388 = local_448;
      local_328 = local_448;
      local_2e0 = local_690;
      uStack_2d8 = uStack_688;
      local_240 = local_680;
      uStack_238 = uStack_678;
      local_230 = local_660;
      uStack_228 = uStack_658;
      local_210 = local_750;
      local_1e0 = local_660;
      uStack_1d8 = uStack_658;
      local_1d0 = local_670;
      uStack_1c8 = uStack_668;
      uStack_1ac = local_1b0;
      uStack_1a8 = local_1b0;
      uStack_1a4 = local_1b0;
      uStack_18c = local_190;
      uStack_188 = local_190;
      uStack_184 = local_190;
      uStack_16c = local_170;
      uStack_168 = local_170;
      uStack_164 = local_170;
      uStack_14c = local_150;
      uStack_148 = local_150;
      uStack_144 = local_150;
      uStack_12c = local_130;
      uStack_128 = local_130;
      uStack_124 = local_130;
      uStack_10c = local_110;
      uStack_108 = local_110;
      uStack_104 = local_110;
      uStack_ec = local_f0;
      uStack_e8 = local_f0;
      uStack_e4 = local_f0;
      uStack_cc = local_d0;
      uStack_c8 = local_d0;
      uStack_c4 = local_d0;
      uStack_ac = local_b0;
      uStack_a8 = local_b0;
      uStack_a4 = local_b0;
      uStack_8c = local_90;
      uStack_88 = local_90;
      uStack_84 = local_90;
      uStack_6c = local_70;
      uStack_68 = local_70;
      uStack_64 = local_70;
      uStack_4c = local_50;
      uStack_48 = local_50;
      uStack_44 = local_50;
    }
    for (; local_189c < local_1844; local_189c = local_189c + 1) {
      local_16e8 = local_1829;
      local_16f0 = local_1850;
      in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
      fVar22 = acosf(*(float *)*local_1850);
      *(float *)*local_1850 = fVar22;
      local_1850 = (undefined1 (*) [32])(*local_1850 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}